

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O1

bool checkValidMeasurement(Vector3 *in,string *measurement_type,bool check_also_zero_vector)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_30 [2];
  long local_20 [2];
  
  if ((((int)CONCAT71(in_register_00000011,check_also_zero_vector) != 0) && (in->m_data[0] == 0.0))
     && (!NAN(in->m_data[0]))) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 2) {
      if ((in->m_data[uVar3 + 1] != 0.0) || (uVar2 = uVar3 + 1, NAN(in->m_data[uVar3 + 1]))) break;
    }
    if (1 < uVar3) {
      local_30[0] = local_20;
      pcVar1 = (measurement_type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_30,pcVar1,pcVar1 + measurement_type->_M_string_length);
      std::__cxx11::string::append((char *)local_30);
      iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",(char *)local_30[0]);
      goto LAB_0015e9ad;
    }
  }
  if (!NAN(in->m_data[0])) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (uVar3 == 2) break;
      uVar2 = uVar3 + 1;
    } while (!NAN(in->m_data[uVar3 + 1]));
    if (1 < uVar3) {
      return true;
    }
  }
  local_30[0] = local_20;
  pcVar1 = (measurement_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + measurement_type->_M_string_length);
  std::__cxx11::string::append((char *)local_30);
  iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",(char *)local_30[0]);
LAB_0015e9ad:
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return false;
}

Assistant:

bool checkValidMeasurement(const iDynTree::Vector3& in, const std::string& measurement_type, bool check_also_zero_vector)
{
    if (check_also_zero_vector)
    {
        if (isZeroVector(in))
        {
            iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                                  (measurement_type + " measurements are invalid. Expecting a non-zero vector.").c_str());
            return false;
        }
    }

    if (isVectorNaN(in))
    {
        iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                              (measurement_type + " measurements are invalid. Has NaN elements.").c_str());
        return false;
    }

    return true;
}